

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O1

void mxx::impl::scatterv_big<std::tuple<int,int,int>>
               (tuple<int,_int,_int> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               tuple<int,_int,_int> *out,size_t recv_size,int root,comm *comm)

{
  unsigned_long uVar1;
  MPI_Comm poVar2;
  MPI_Datatype poVar3;
  long lVar4;
  MPI_Request *ppoVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  datatype dt_1;
  datatype dt;
  requests reqs;
  datatype local_88;
  datatype local_70;
  requests local_58;
  ulong local_38;
  
  local_58._vptr_requests = (_func_int **)&PTR__requests_001631e8;
  local_58.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (comm->m_rank == root) {
    if (0 < comm->m_size) {
      uVar7 = 0;
      lVar8 = 0;
      local_38 = (ulong)(uint)root;
      do {
        local_88.mpitype = datatype_builder<std::tuple<int,_int,_int>_>::get_type();
        local_88._vptr_datatype = (_func_int **)&PTR__datatype_001631b8;
        local_88.builtin = false;
        datatype::contiguous
                  (&local_70,&local_88,
                   (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar7]);
        datatype::~datatype(&local_88);
        poVar3 = local_70.mpitype;
        if (uVar7 == local_38) {
          uVar1 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start[uVar7];
          if (0 < (long)uVar1) {
            lVar4 = uVar1 + 1;
            lVar6 = 8;
            do {
              *(undefined4 *)
               ((long)&(out->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>
                       .super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl +
               lVar6) = *(undefined4 *)
                         ((long)&msgs[lVar8].super__Tuple_impl<0UL,_int,_int,_int>.
                                 super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                                 super__Head_base<2UL,_int,_false>._M_head_impl + lVar6);
              *(undefined4 *)((long)out + lVar6 + -4) =
                   *(undefined4 *)((long)msgs + lVar6 + lVar8 * 0xc + -4);
              *(undefined4 *)((long)out + lVar6 + -8) =
                   *(undefined4 *)((long)msgs + lVar6 + lVar8 * 0xc + -8);
              lVar4 = lVar4 + -1;
              lVar6 = lVar6 + 0xc;
            } while (1 < lVar4);
          }
        }
        else {
          poVar2 = comm->mpi_comm;
          ppoVar5 = requests::add(&local_58);
          MPI_Isend(msgs + lVar8,1,poVar3,uVar7 & 0xffffffff,0x4d2,poVar2,ppoVar5);
        }
        lVar8 = lVar8 + (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar7];
        datatype::~datatype(&local_70);
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)comm->m_size);
    }
  }
  else {
    local_88.mpitype = datatype_builder<std::tuple<int,_int,_int>_>::get_type();
    local_88._vptr_datatype = (_func_int **)&PTR__datatype_001631b8;
    local_88.builtin = false;
    datatype::contiguous(&local_70,&local_88,recv_size);
    datatype::~datatype(&local_88);
    poVar2 = comm->mpi_comm;
    ppoVar5 = requests::add(&local_58);
    MPI_Irecv(out,1,local_70.mpitype,(ulong)(uint)root,0x4d2,poVar2,ppoVar5);
    datatype::~datatype(&local_70);
  }
  MPI_Waitall((ulong)((long)local_58.m_requests.
                            super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.m_requests.
                           super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3,
              local_58.m_requests.
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
              super__Vector_impl_data._M_start,0);
  requests::~requests(&local_58);
  return;
}

Assistant:

void scatterv_big(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        std::size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(msgs+offset, msgs+offset+sizes[i], out);
            } else {
                MPI_Isend(const_cast<T*>(msgs)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_size);
        MPI_Irecv(const_cast<T*>(out), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}